

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

int32_t __thiscall wasm::WasmBinaryReader::getS32LEB(WasmBinaryReader *this)

{
  size_t in_RCX;
  void *in_RDX;
  WasmBinaryReader *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  LEB<int,_signed_char> local_14 [2];
  S32LEB ret;
  
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<signed_char_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp:2046:12)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<signed_char_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp:2046:12)>
             ::_M_manager;
  local_38 = this;
  LEB<int,_signed_char>::read(local_14,(int)&local_38,in_RDX,in_RCX);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  return local_14[0].value;
}

Assistant:

int32_t WasmBinaryReader::getS32LEB() {
  S32LEB ret;
  ret.read([&]() { return (int8_t)getInt8(); });
  return ret.value;
}